

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_VSPrintfMakeWArgsExample_Test::TestBody(PrintfTest_VSPrintfMakeWArgsExample_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  args2;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_int,_wchar_t[10]>
  as2;
  AssertionResult gtest_ar;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  args;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_int,_const_wchar_t_*>
  as;
  wchar_t (*in_stack_000006d8) [17];
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  in_stack_000006e0;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_int,_wchar_t[10]>
  *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  wchar_t (*in_stack_fffffffffffffe98) [24];
  wchar_t (*expected) [24];
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_int,_const_wchar_t_*>
  *in_stack_fffffffffffffea0;
  wstring *actual_expression;
  char *in_stack_fffffffffffffea8;
  int line;
  undefined7 in_stack_fffffffffffffeb0;
  Type type;
  AssertHelper *this_00;
  wstring local_110 [24];
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  wchar_t local_c8 [16];
  wchar_t local_88 [2];
  wchar_t awStack_80 [2];
  AssertHelper local_78 [4];
  AssertionResult local_58;
  wchar_t local_48 [2];
  wchar_t awStack_40 [2];
  wchar_t *local_38;
  undefined4 local_2c;
  undefined1 local_28 [40];
  
  local_2c = 0x2a;
  local_38 = L"something";
  type = (Type)((ulong)local_28 >> 0x20);
  fmt::v5::
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_int,_const_wchar_t_*>
  ::format_arg_store(in_stack_fffffffffffffea0,*in_stack_fffffffffffffe98,
                     (wchar_t **)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  fmt::v5::
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
  ::basic_format_args<int,wchar_t_const*>
            ((basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_int,_const_wchar_t_*>
              *)in_stack_fffffffffffffe88);
  local_88[0] = local_48[0];
  local_88[1] = local_48[1];
  awStack_80[0] = awStack_40[0];
  awStack_80[1] = awStack_40[1];
  this_00 = local_78;
  fmt::v5::vsprintf<wchar_t[17],wchar_t>(in_stack_000006d8,in_stack_000006e0);
  testing::internal::EqHelper<false>::Compare<wchar_t[24],std::__cxx11::wstring>
            (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::wstring::~wstring((wstring *)local_78);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffea8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x139669);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffeb0),
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(char *)in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x1396c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13971e);
  expected = (wchar_t (*) [24])local_c8;
  fmt::v5::make_wprintf_args<int,wchar_t[10]>
            ((int *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (wchar_t (*) [10])in_stack_fffffffffffffe88);
  fmt::v5::
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
  ::basic_format_args<int,wchar_t[10]>
            ((basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  actual_expression = local_110;
  fmt::v5::vsprintf<wchar_t[17],wchar_t>(in_stack_000006d8,in_stack_000006e0);
  testing::internal::EqHelper<false>::Compare<wchar_t[24],std::__cxx11::wstring>
            (in_stack_fffffffffffffea8,(char *)actual_expression,expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  line = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  std::__cxx11::wstring::~wstring(local_110);
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff10);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x139845);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffeb0),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    testing::Message::~Message((Message *)0x139891);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1398e0);
  return;
}

Assistant:

TEST(PrintfTest, VSPrintfMakeWArgsExample) {
  fmt::format_arg_store<fmt::wprintf_context, int, const wchar_t *> as{
     42, L"something"};
  fmt::basic_format_args<fmt::wprintf_context> args(as);
  EXPECT_EQ(
     L"[42] something happened",
     fmt::vsprintf(L"[%d] %s happened", args));
  auto  as2 = fmt::make_wprintf_args(42, L"something");
  fmt::basic_format_args<fmt::wprintf_context> args2(as2);
  EXPECT_EQ(
      L"[42] something happened", fmt::vsprintf(L"[%d] %s happened", args2));
  // the older gcc versions can't cast the return value
#if !defined(__GNUC__) || (__GNUC__ > 4)
  EXPECT_EQ(
      L"[42] something happened",
      fmt::vsprintf(
          L"[%d] %s happened", fmt::make_wprintf_args(42, L"something")));
#endif
}